

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O1

void Acec_TreeVerifyConnections(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Wec_t *vBoxes)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  void *__s;
  int *piVar7;
  long lVar8;
  uint uVar9;
  size_t __size;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  size_t __size_00;
  
  uVar1 = p->nObjs;
  lVar14 = (long)(int)uVar1;
  uVar9 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar9 = uVar1;
  }
  if (uVar9 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar9 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0xff,lVar14 * 4);
  }
  iVar16 = vBoxes->nSize;
  if (0 < (long)iVar16) {
    pVVar5 = vBoxes->pArray;
    lVar8 = 0;
    do {
      if (0 < pVVar5[lVar8].nSize) {
        piVar7 = pVVar5[lVar8].pArray;
        lVar10 = 0;
        do {
          iVar2 = piVar7[lVar10];
          if (iVar2 < 0) goto LAB_0067d57c;
          uVar9 = iVar2 * 6 + 3;
          iVar3 = vAdds->nSize;
          if (iVar3 <= (int)uVar9) goto LAB_0067d57c;
          piVar6 = vAdds->pArray;
          iVar4 = piVar6[uVar9];
          if (((long)iVar4 < 0) || ((int)uVar1 <= iVar4)) {
LAB_0067d59b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)((long)__s + (long)iVar4 * 4) = 0;
          uVar9 = iVar2 * 6 + 4;
          if (iVar3 <= (int)uVar9) goto LAB_0067d57c;
          iVar2 = piVar6[uVar9];
          if (((long)iVar2 < 0) || ((int)uVar1 <= iVar2)) goto LAB_0067d59b;
          *(undefined4 *)((long)__s + (long)iVar2 * 4) = 0;
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar5[lVar8].nSize);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar16);
  }
  iVar16 = vBoxes->nSize;
  if (0 < (long)iVar16) {
    pVVar5 = vBoxes->pArray;
    lVar8 = 0;
    do {
      if (0 < pVVar5[lVar8].nSize) {
        piVar7 = pVVar5[lVar8].pArray;
        lVar10 = 0;
        do {
          iVar2 = piVar7[lVar10];
          lVar11 = (long)(iVar2 * 6);
          lVar12 = 3;
          do {
            if ((iVar2 < 0) || (vAdds->nSize <= lVar11)) goto LAB_0067d57c;
            lVar17 = (long)vAdds->pArray[lVar11];
            if ((lVar17 < 0) || ((int)uVar1 <= vAdds->pArray[lVar11])) goto LAB_0067d57c;
            iVar3 = *(int *)((long)__s + lVar17 * 4);
            if (iVar3 != -1) {
              *(int *)((long)__s + lVar17 * 4) = iVar3 + 1;
            }
            lVar11 = lVar11 + 1;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar5[lVar8].nSize);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar16);
  }
  if ((int)uVar1 < 1) {
    printf("The adder tree has %d internal cut points. ",0);
  }
  else {
    lVar8 = 0;
    do {
      lVar8 = lVar8 + 1;
    } while (lVar14 != lVar8);
    iVar16 = 0;
    printf("The adder tree has %d internal cut points. ");
    if (0 < (int)uVar1) {
      lVar8 = 0;
      do {
        iVar16 = iVar16 + (uint)(1 < *(int *)((long)__s + lVar8 * 4));
        lVar8 = lVar8 + 1;
      } while (lVar14 != lVar8);
      if (iVar16 != 0) {
        if (0 < (int)uVar1) {
          lVar8 = 0;
          do {
            lVar8 = lVar8 + 1;
          } while (lVar14 != lVar8);
        }
        printf("These %d points have more than one fanout:\n");
        __size_00 = 4;
        uVar15 = 0;
        do {
          uVar9 = *(uint *)((long)__s + uVar15 * 4);
          if (1 < (int)uVar9) {
            pVVar5 = p->vLevels;
            iVar16 = (int)uVar15;
            if ((long)pVVar5->nSize <= (long)uVar15) {
              lVar14 = (long)pVVar5->nCap;
              uVar13 = lVar14 * 2;
              if (SBORROW8(uVar15,uVar13) == (long)(uVar15 + lVar14 * -2) < 0) {
                if (lVar14 <= (long)uVar15) {
                  if (pVVar5->pArray == (int *)0x0) {
                    piVar7 = (int *)malloc(__size_00);
                  }
                  else {
                    piVar7 = (int *)realloc(pVVar5->pArray,__size_00);
                  }
                  pVVar5->pArray = piVar7;
                  if (piVar7 == (int *)0x0) goto LAB_0067d5ba;
                  uVar13 = (ulong)(iVar16 + 1);
                  goto LAB_0067d4e6;
                }
              }
              else if (pVVar5->nCap < (int)uVar13 && lVar14 <= (long)uVar15) {
                __size = (long)(int)uVar13 << 2;
                if (pVVar5->pArray == (int *)0x0) {
                  piVar7 = (int *)malloc(__size);
                }
                else {
                  piVar7 = (int *)realloc(pVVar5->pArray,__size);
                }
                pVVar5->pArray = piVar7;
                if (piVar7 == (int *)0x0) {
LAB_0067d5ba:
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                }
LAB_0067d4e6:
                pVVar5->nCap = (int)uVar13;
              }
              iVar2 = pVVar5->nSize;
              if ((long)iVar2 <= (long)uVar15) {
                memset(pVVar5->pArray + iVar2,0,(ulong)(uint)(iVar16 - iVar2) * 4 + 4);
              }
              pVVar5->nSize = iVar16 + 1;
            }
            if ((long)pVVar5->nSize <= (long)uVar15) {
LAB_0067d57c:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            printf("Node %d(lev %d) has fanout %d.\n",uVar15 & 0xffffffff,
                   (ulong)(uint)pVVar5->pArray[uVar15],(ulong)uVar9);
          }
          uVar15 = uVar15 + 1;
          __size_00 = __size_00 + 4;
        } while (uVar1 != uVar15);
        goto LAB_0067d552;
      }
    }
  }
  puts("There is no internal fanouts.");
LAB_0067d552:
  if (__s == (void *)0x0) {
    return;
  }
  free(__s);
  return;
}

Assistant:

void Acec_TreeVerifyConnections( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes )
{
    Vec_Int_t * vCounts = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;
    int i, k, n, Box;
    // mark outputs
    Vec_WecForEachLevel( vBoxes, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
        {
            Vec_IntWriteEntry( vCounts, Vec_IntEntry( vAdds, 6*Box+3 ), 0 );
            Vec_IntWriteEntry( vCounts, Vec_IntEntry( vAdds, 6*Box+4 ), 0 );
        }
    // count fanouts
    Vec_WecForEachLevel( vBoxes, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
            for ( n = 0; n < 3; n++ )
                if ( Vec_IntEntry( vCounts, Vec_IntEntry(vAdds, 6*Box+n) ) != -1 )
                    Vec_IntAddToEntry( vCounts, Vec_IntEntry(vAdds, 6*Box+n), 1 );
    // print out
    printf( "The adder tree has %d internal cut points. ", Vec_IntCountLarger(vCounts, -1) );
    if ( Vec_IntCountLarger(vCounts, 1) == 0 )
        printf( "There is no internal fanouts.\n" );
    else
    {
        printf( "These %d points have more than one fanout:\n", Vec_IntCountLarger(vCounts, 1) );
        Vec_IntForEachEntry( vCounts, Box, i )
            if ( Box > 1 )
                printf( "Node %d(lev %d) has fanout %d.\n", i, Gia_ObjLevelId(p, i), Box );
    }
    Vec_IntFree( vCounts );
}